

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.h
# Opt level: O1

char * __thiscall
btGeneric6DofConstraint::serialize
          (btGeneric6DofConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  int i_2;
  btTransform *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  pbVar1 = &this->m_frameInA;
  lVar2 = (long)dataBuffer + 0x40;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(btScalar *)(lVar2 + lVar4 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0x70) = (this->m_frameInA).m_origin.m_floats[lVar2]
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pbVar1 = &this->m_frameInB;
  lVar2 = (long)dataBuffer + 0x80;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(btScalar *)(lVar2 + lVar4 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0xb0) = (this->m_frameInB).m_origin.m_floats[lVar2]
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = -0x30;
  lVar3 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar3 + 0xf0) =
         (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[lVar2 + -1];
    *(btScalar *)((long)dataBuffer + lVar3 + 0xe0) =
         (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[lVar2];
    *(undefined4 *)((long)dataBuffer + lVar3 + 0xd0) =
         *(undefined4 *)((long)(this->m_linearLimits).m_lowerLimit.m_floats + lVar3);
    *(undefined4 *)((long)dataBuffer + lVar3 + 0xc0) =
         *(undefined4 *)((long)(this->m_linearLimits).m_upperLimit.m_floats + lVar3);
    lVar3 = lVar3 + 4;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0);
  *(uint *)((long)dataBuffer + 0x100) = (uint)this->m_useLinearReferenceFrameA;
  *(uint *)((long)dataBuffer + 0x104) = (uint)this->m_useOffsetForConstraintFrame;
  return "btGeneric6DofConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGeneric6DofConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btGeneric6DofConstraintData2* dof = (btGeneric6DofConstraintData2*)dataBuffer;
	btTypedConstraint::serialize(&dof->m_typeConstraintData,serializer);

	m_frameInA.serialize(dof->m_rbAFrame);
	m_frameInB.serialize(dof->m_rbBFrame);

		
	int i;
	for (i=0;i<3;i++)
	{
		dof->m_angularLowerLimit.m_floats[i] =  m_angularLimits[i].m_loLimit;
		dof->m_angularUpperLimit.m_floats[i] =  m_angularLimits[i].m_hiLimit;
		dof->m_linearLowerLimit.m_floats[i] = m_linearLimits.m_lowerLimit[i];
		dof->m_linearUpperLimit.m_floats[i] = m_linearLimits.m_upperLimit[i];
	}
	
	dof->m_useLinearReferenceFrameA = m_useLinearReferenceFrameA? 1 : 0;
	dof->m_useOffsetForConstraintFrame = m_useOffsetForConstraintFrame ? 1 : 0;

	return btGeneric6DofConstraintDataName;
}